

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

bool __thiscall Func::DoSimpleJitDynamicProfile(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  Func *pFVar2;
  byte local_11;
  Func *this_local;
  
  bVar1 = IsSimpleJit(this);
  local_11 = 0;
  if (bVar1) {
    pFVar2 = GetTopFunc(this);
    sourceContextId = GetSourceContextId(pFVar2);
    pFVar2 = GetTopFunc(this);
    functionId = GetLocalFunctionId(pFVar2);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,SimpleJitDynamicProfilePhase,sourceContextId,
                       functionId);
    local_11 = 0;
    if (!bVar1) {
      local_11 = DAT_01eafdac ^ 0xff;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool
Func::DoSimpleJitDynamicProfile() const
{
    return IsSimpleJit() && !PHASE_OFF(Js::SimpleJitDynamicProfilePhase, GetTopFunc()) && !CONFIG_FLAG(NewSimpleJit);
}